

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall QGraphicsSceneBspTreeIndex::clear(QGraphicsSceneBspTreeIndex *this)

{
  QGraphicsSceneBspTreeIndexPrivate *pQVar1;
  long i_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem *item;
  int i;
  QGraphicsSceneBspTreeIndexPrivate *d;
  QGraphicsSceneBspTree *in_stack_ffffffffffffffe0;
  int local_14;
  
  pQVar1 = d_func((QGraphicsSceneBspTreeIndex *)0xa1f297);
  QGraphicsSceneBspTree::clear(in_stack_ffffffffffffffe0);
  pQVar1->lastItemCount = 0;
  QList<int>::clear((QList<int> *)in_stack_ffffffffffffffe0);
  local_14 = 0;
  while( true ) {
    i_00 = (long)local_14;
    qVar2 = QList<QGraphicsItem_*>::size(&pQVar1->indexedItems);
    if (qVar2 <= i_00) break;
    ppQVar3 = QList<QGraphicsItem_*>::at((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffe0,i_00);
    in_stack_ffffffffffffffe0 = (QGraphicsSceneBspTree *)*ppQVar3;
    if (in_stack_ffffffffffffffe0 != (QGraphicsSceneBspTree *)0x0) {
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(in_stack_ffffffffffffffe0->nodes).d.ptr);
      pQVar4->index = -1;
    }
    local_14 = local_14 + 1;
  }
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffe0);
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffe0);
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffe0);
  pQVar1->regenerateIndex = true;
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndex::clear()
{
    Q_D(QGraphicsSceneBspTreeIndex);
    d->bsp.clear();
    d->lastItemCount = 0;
    d->freeItemIndexes.clear();
    for (int i = 0; i < d->indexedItems.size(); ++i) {
        // Ensure item bits are reset properly.
        if (QGraphicsItem *item = d->indexedItems.at(i)) {
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            item->d_ptr->index = -1;
        }
    }
    d->indexedItems.clear();
    d->unindexedItems.clear();
    d->untransformableItems.clear();
    d->regenerateIndex = true;
}